

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32.c
# Opt level: O3

void elf32_writestabstr(FILE *f)

{
  node *pnVar1;
  node *pnVar2;
  
  if (stabdebugidx != 0) {
    pnVar1 = (stabcompunits.first)->next;
    pnVar2 = stabcompunits.first;
    while (pnVar1 != (node *)0x0) {
      elf_writestrtab(f,(StrTabList *)&pnVar2[3].pred);
      pnVar2 = pnVar2->next;
      pnVar1 = pnVar2->next;
    }
  }
  return;
}

Assistant:

static void elf32_writestabstr(FILE *f)
{
  if (stabdebugidx) {
    struct StabCompUnit *cu;

    for (cu=(struct StabCompUnit *)stabcompunits.first;
         cu->n.next!=NULL; cu=(struct StabCompUnit *)cu->n.next)
      elf_writestrtab(f,&cu->strtab);
  }
}